

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  TcParseTableBase *pTVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  string *psVar11;
  char *pcVar12;
  uint *puVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 offset;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  int v1;
  ParseContext *delta;
  ParseContext *local_78 [2];
  MessageLite *local_68;
  uint64_t local_60;
  TcParseTableBase *local_58;
  undefined1 local_50 [32];
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  uVar1 = *(ushort *)ptr;
  pTVar3 = *(TcParseTableBase **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  offset = data.field_0 >> 0x30;
  local_68 = msg;
  local_60 = hasbits;
  local_58 = table;
  local_50._16_8_ = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(msg,offset.data);
  local_50._8_8_ = pTVar3 + 1;
  local_50._24_8_ = pTVar3;
LAB_002608b1:
  delta = (ParseContext *)local_50._16_8_;
  pMVar9 = AddMessage((TcParseTableBase *)local_50._24_8_,(RepeatedPtrFieldBase *)local_50._16_8_);
  local_78[0] = (ParseContext *)
                ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
  uVar7 = ReadSize((char **)local_78);
  ctx_00 = local_78[0];
  if ((local_78[0] != (ParseContext *)0x0) && (0 < ctx->depth_)) {
    offset.data._4_4_ = 0;
    offset.data._0_4_ = uVar7;
    delta = ctx;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)(local_50 + 4),(char *)ctx,(int)local_78[0])
    ;
    uVar5 = local_50._8_8_;
    uVar4 = local_50._4_4_;
    v1 = ctx->depth_ + -1;
    ctx->depth_ = v1;
    ctx_00 = extraout_RDX;
    if (local_78[0] != (ParseContext *)0x0) {
      while (bVar6 = ParseContext::Done(ctx,(char **)local_78), !bVar6) {
        uVar2 = *(ushort *)&(local_78[0]->super_EpsCopyInputStream).limit_end_;
        uVar8 = (uint)((TcParseTableBase *)(uVar5 + -0x38))->fast_idx_mask & (uint)uVar2;
        if ((uVar8 & 7) != 0) goto LAB_00260aa0;
        uVar10 = (ulong)(uVar8 & 0xfffffff8);
        offset.data = (ulong)uVar2 ^ *(ulong *)((uint8_t *)(uVar5 + 8) + uVar10 * 2);
        local_78[0] = (ParseContext *)
                      (**(code **)((uint16_t *)uVar5 + uVar10))
                                (pMVar9,local_78[0],ctx,offset.data,
                                 (TcParseTableBase *)(uVar5 + -0x38),0);
        if ((local_78[0] == (ParseContext *)0x0) ||
           ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      ptr = (char *)local_78[0];
      if ((((TcParseTableBase *)(uVar5 + -0x38))->field_0x9 & 1) != 0) {
        ptr = (*((TcParseTableBase *)(uVar5 + -0x38))->post_loop_handler)
                        (pMVar9,(char *)local_78[0],ctx);
      }
      if (((ParseContext *)ptr != (ParseContext *)0x0) &&
         (psVar11 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                              (v1,ctx->depth_,"old_depth == depth_"), psVar11 != (string *)0x0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,psVar11->_M_string_length,(psVar11->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_78);
      }
      ctx->depth_ = ctx->depth_ + 1;
      local_50._0_4_ = uVar4;
      delta = (ParseContext *)local_50;
      bVar6 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)delta);
      ctx_00 = extraout_RDX_00;
      if ((bVar6) && ((ParseContext *)ptr != (ParseContext *)0x0)) goto code_r0x002609c9;
    }
  }
  pcVar12 = Error(local_68,(char *)delta,ctx_00,(TcFieldData)offset,local_58,local_60);
  return pcVar12;
code_r0x002609c9:
  if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)local_58->has_bits_offset != 0) {
      puVar13 = RefAt<unsigned_int>(local_68,(ulong)local_58->has_bits_offset);
      *puVar13 = *puVar13 | (uint)local_60;
    }
    return (char *)(ParseContext *)ptr;
  }
  uVar2 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
  offset.data._2_6_ = 0;
  offset.data._0_2_ = uVar2;
  if (uVar2 != uVar1) {
    uVar8 = (uint)local_58->fast_idx_mask & (uint)uVar2;
    if ((uVar8 & 7) == 0) {
      uVar10 = (ulong)(uVar8 & 0xfffffff8);
      pcVar12 = (char *)(**(code **)(&local_58[1].has_bits_offset + uVar10))
                                  (local_68,ptr,ctx,
                                   offset.data ^ *(ulong *)(&local_58[1].fast_idx_mask + uVar10 * 2)
                                   ,local_58,local_60);
      return pcVar12;
    }
LAB_00260aa0:
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  goto LAB_002608b1;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}